

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmRenderSettingsPrivate::SpecializeSun(ON_3dmRenderSettingsPrivate *this,ON_Sun *sun)

{
  ON_Sun *sun_local;
  ON_3dmRenderSettingsPrivate *this_local;
  
  ON_REMOVE_ASAP_AssertEx
            ((uint)((this->_sun_specialized ^ 0xffU) & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
             ,0x4af,"","!_sun_specialized is false");
  ON_Sun::SetXMLNode(sun,&(this->_rdk_document_data).super_ON_XMLNode);
  if (this->_sun != (ON_Sun *)0x0) {
    (*this->_sun->_vptr_ON_Sun[1])();
  }
  this->_sun = sun;
  this->_sun_specialized = true;
  return;
}

Assistant:

void ON_3dmRenderSettingsPrivate::SpecializeSun(ON_Sun& sun)
{
  // This is called from ON_SpecializeDocumentObjects() and is only called once during the lifetime of this.
  ON_ASSERT(!_sun_specialized);

  // Make the incoming object use the document data of this.
  sun.SetXMLNode(_rdk_document_data);

  // Replace the vanilla sun with the incoming object. This takes ownership of it.
  delete _sun;
  _sun = &sun;

  _sun_specialized = true;
}